

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Type> *
wasm::WATParser::singlevaltype<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  undefined8 *puVar1;
  _Uninitialized<wasm::Type,_true> _Var2;
  bool bVar3;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  undefined1 local_b8 [8];
  MaybeResult<wasm::Type> type;
  long local_80;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  undefined1 local_50 [8];
  MaybeResult<wasm::Type> _val;
  
  this = &ctx->in;
  expected._M_str = "i32";
  expected._M_len = 3;
  bVar3 = Lexer::takeKeyword(this,expected);
  if (bVar3) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err> = 2;
  }
  else {
    expected_00._M_str = "i64";
    expected_00._M_len = 3;
    bVar3 = Lexer::takeKeyword(this,expected_00);
    if (bVar3) {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err> = 3;
    }
    else {
      expected_01._M_str = "f32";
      expected_01._M_len = 3;
      bVar3 = Lexer::takeKeyword(this,expected_01);
      if (bVar3) {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err> = 4;
      }
      else {
        expected_02._M_str = "f64";
        expected_02._M_len = 3;
        bVar3 = Lexer::takeKeyword(this,expected_02);
        if (bVar3) {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err> = 5;
        }
        else {
          expected_03._M_str = "v128";
          expected_03._M_len = 4;
          bVar3 = Lexer::takeKeyword(this,expected_03);
          if (!bVar3) {
            maybeReftype<wasm::WATParser::ParseModuleTypesCtx>
                      ((MaybeResult<wasm::Type> *)local_b8,ctx);
            if (type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                '\x01') {
              type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._32_8_ =
                   &stack0xffffffffffffff80;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)
                         ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),
                         "expected valtype","");
              Lexer::err((Err *)local_50,this,
                         (string *)
                         ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Type,_wasm::Err>.
                               super__Move_assign_alias<wasm::Type,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                super__Move_assign_alias<wasm::Type,_wasm::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::Err> = puVar1;
              _Var2._M_storage.id =
                   (Type)((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 8);
              if ((Type)local_50 == _Var2._M_storage.id) {
                *puVar1 = CONCAT71(_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   _M_u._9_7_,
                                   _val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   _M_u._8_1_);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x18) =
                     _val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._16_8_;
              }
              else {
                *(undefined1 (*) [8])
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::Err> = local_50;
                *(ulong *)((long)&(__return_storage_ptr__->val).
                                  super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10) =
                     CONCAT71(_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u.
                              _9_7_,_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                    _M_u._8_1_);
              }
              ((_Uninitialized<wasm::Type,_true> *)
              ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Type,_wasm::Err> + 8))->_M_storage =
                   (Type)_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u.
                         _M_first._M_storage.id;
              _val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first.
              _M_storage.id = (_Uninitialized<wasm::Type,_true>)(Type)0x0;
              _val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\x01';
              local_50 = (undefined1  [8])_Var2;
              if ((long *)type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._32_8_ !=
                  &stack0xffffffffffffff80) {
                operator_delete((void *)type.val.
                                        super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                        ._32_8_,local_80 + 1);
              }
            }
            else {
              std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err>::
              _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_50,
                              (_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_b8)
              ;
              if (_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                  '\x02') {
                local_70 = &local_60;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_70,local_50,
                           (pointer)((long)_val.val.
                                           super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                           .
                                           super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                           ._M_u._M_first._M_storage.id + (long)local_50));
                puVar1 = (undefined8 *)
                         ((long)&(__return_storage_ptr__->val).
                                 super__Variant_base<wasm::Type,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10);
                *(undefined8 **)
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::Err> = puVar1;
                if (local_70 == &local_60) {
                  *puVar1 = CONCAT71(uStack_5f,local_60);
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x18) = uStack_58;
                }
                else {
                  *(undefined1 **)
                   &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Type,_wasm::Err> = local_70;
                  *(ulong *)((long)&(__return_storage_ptr__->val).
                                    super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10) =
                       CONCAT71(uStack_5f,local_60);
                }
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err> + 8) = local_68;
                local_68 = 0;
                local_60 = 0;
                *(__index_type *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\x01';
                local_70 = &local_60;
                std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>
                ::~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                                    local_50);
              }
              else {
                std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>
                ::~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                                    local_50);
                *(undefined1 (*) [8])
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::Err> = local_b8;
                *(__index_type *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\0';
              }
            }
            std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_b8
                             );
            return __return_storage_ptr__;
          }
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err> = 6;
        }
      }
    }
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> singlevaltype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i32"sv)) {
    return ctx.makeI32();
  } else if (ctx.in.takeKeyword("i64"sv)) {
    return ctx.makeI64();
  } else if (ctx.in.takeKeyword("f32"sv)) {
    return ctx.makeF32();
  } else if (ctx.in.takeKeyword("f64"sv)) {
    return ctx.makeF64();
  } else if (ctx.in.takeKeyword("v128"sv)) {
    return ctx.makeV128();
  } else if (auto type = maybeReftype(ctx)) {
    CHECK_ERR(type);
    return *type;
  } else {
    return ctx.in.err("expected valtype");
  }
}